

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lowdiscrepancy.cpp
# Opt level: O2

string * __thiscall
pbrt::ToString_abi_cxx11_(string *__return_storage_ptr__,pbrt *this,RandomizeStrategy r)

{
  allocator<char> *__a;
  char *__s;
  allocator<char> local_d;
  allocator<char> local_c;
  allocator<char> local_b;
  allocator<char> local_a;
  allocator<char> local_9;
  
  switch((ulong)this & 0xffffffff) {
  case 0:
    __s = "None";
    __a = &local_9;
    break;
  case 1:
    __s = "CranleyPatterson";
    __a = &local_a;
    break;
  case 2:
    __s = "PermuteDigits";
    __a = &local_b;
    break;
  case 3:
    __s = "FastOwen";
    __a = &local_c;
    break;
  case 4:
    __s = "Owen";
    __a = &local_d;
    break;
  default:
    LogFatal(Fatal,
             "/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/util/lowdiscrepancy.cpp"
             ,0x2d,"Unhandled RandomizeStrategy");
  }
  std::__cxx11::string::string<std::allocator<char>>((string *)__return_storage_ptr__,__s,__a);
  return __return_storage_ptr__;
}

Assistant:

std::string ToString(RandomizeStrategy r) {
    switch (r) {
    case RandomizeStrategy::None:
        return "None";
    case RandomizeStrategy::CranleyPatterson:
        return "CranleyPatterson";
    case RandomizeStrategy::PermuteDigits:
        return "PermuteDigits";
    case RandomizeStrategy::FastOwen:
        return "FastOwen";
    case RandomizeStrategy::Owen:
        return "Owen";
    default:
        LOG_FATAL("Unhandled RandomizeStrategy");
        return "";
    }
}